

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::dispose
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
           *this)

{
  DataLocationUsage *firstElement;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar1;
  DataLocationUsage *pDVar2;
  DataLocationUsage *endCopy;
  DataLocationUsage *posCopy;
  DataLocationUsage *ptrCopy;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pDVar2 = this->endPtr;
  if (firstElement != (DataLocationUsage *)0x0) {
    this->ptr = (DataLocationUsage *)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                 *)0x0;
    this->endPtr = (DataLocationUsage *)0x0;
    ArrayDisposer::dispose<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)pDVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }